

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseNodeFree(Fts5ExprNode *p)

{
  int local_14;
  int i;
  Fts5ExprNode *p_local;
  
  if (p != (Fts5ExprNode *)0x0) {
    for (local_14 = 0; local_14 < p->nChild; local_14 = local_14 + 1) {
      sqlite3Fts5ParseNodeFree(p->apChild[local_14]);
    }
    sqlite3Fts5ParseNearsetFree(p->pNear);
    sqlite3_free(p);
  }
  return;
}

Assistant:

static void sqlite3Fts5ParseNodeFree(Fts5ExprNode *p){
  if( p ){
    int i;
    for(i=0; i<p->nChild; i++){
      sqlite3Fts5ParseNodeFree(p->apChild[i]);
    }
    sqlite3Fts5ParseNearsetFree(p->pNear);
    sqlite3_free(p);
  }
}